

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAigerExt.c
# Opt level: O2

uchar * Gia_WriteEquivClassesInt(Gia_Man_t *p,int *pEquivSize)

{
  Gia_Rpr_t *pGVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint x;
  uchar *pBuffer;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  char *__assertion;
  int Id;
  long lVar10;
  ulong uVar11;
  
  pGVar1 = p->pReprs;
  if ((pGVar1 != (Gia_Rpr_t *)0x0) && (piVar2 = p->pNexts, piVar2 != (int *)0x0)) {
    iVar4 = p->nObjs;
    iVar9 = 0;
    for (uVar11 = 1; (long)uVar11 < (long)iVar4; uVar11 = uVar11 + 1) {
      iVar9 = iVar9 + (uint)(((uint)pGVar1[uVar11] & 0xfffffff) == 0);
      iVar3 = Gia_ObjIsHead(p,(int)uVar11);
      if (iVar3 != 0) {
        for (uVar8 = uVar11 & 0xffffffff; 0 < (int)uVar8; uVar8 = (ulong)(uint)piVar2[uVar8]) {
          iVar9 = iVar9 + 1;
        }
      }
    }
    pBuffer = (uchar *)malloc((long)iVar9 * 4 + 0x28);
    iVar3 = Gia_AigerWriteUnsignedBuffer(pBuffer,4,1);
    iVar9 = 0;
    for (lVar10 = 1; lVar10 < iVar4; lVar10 = lVar10 + 1) {
      if (((uint)p->pReprs[lVar10] & 0xfffffff) == 0) {
        iVar4 = Abc_Var2Lit((int)lVar10 - iVar9,(uint)p->pReprs[lVar10] >> 0x1c & 1);
        uVar5 = Abc_Var2Lit(iVar4,0);
        iVar3 = Gia_AigerWriteUnsignedBuffer(pBuffer,iVar3,uVar5);
        iVar4 = p->nObjs;
        iVar9 = (int)lVar10;
      }
    }
    iVar9 = 0;
    uVar11 = 1;
    do {
      if ((long)iVar4 <= (long)uVar11) {
        Gia_AigerWriteInt(pBuffer,iVar3);
        *pEquivSize = iVar3;
        return pBuffer;
      }
      Id = (int)uVar11;
      iVar6 = Gia_ObjIsHead(p,Id);
      if (iVar6 != 0) {
        uVar5 = Abc_Var2Lit(Id - iVar9,1);
        iVar3 = Gia_AigerWriteUnsignedBuffer(pBuffer,iVar3,uVar5);
        iVar4 = Gia_ObjIsHead(p,Id);
        if (iVar4 == 0) {
          __assertion = "Gia_ObjIsHead(p, iRepr)";
          uVar5 = 0x6b;
          goto LAB_001d1f73;
        }
        uVar7 = uVar11 & 0xffffffff;
        uVar8 = uVar11;
        while( true ) {
          uVar5 = p->pNexts[uVar8];
          uVar8 = (ulong)(int)uVar5;
          if ((long)uVar8 < 1) break;
          iVar4 = Abc_Var2Lit(uVar5 - (int)uVar7,(uint)p->pReprs[uVar8] >> 0x1c & 1);
          x = Abc_Var2Lit(iVar4,0);
          iVar3 = Gia_AigerWriteUnsignedBuffer(pBuffer,iVar3,x);
          uVar7 = (ulong)uVar5;
        }
        iVar4 = p->nObjs;
        iVar9 = Id;
      }
      uVar11 = uVar11 + 1;
    } while( true );
  }
  __assertion = "p->pReprs && p->pNexts";
  uVar5 = 0x4f;
LAB_001d1f73:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaAigerExt.c"
                ,uVar5,"unsigned char *Gia_WriteEquivClassesInt(Gia_Man_t *, int *)");
}

Assistant:

unsigned char * Gia_WriteEquivClassesInt( Gia_Man_t * p, int * pEquivSize )
{
    unsigned char * pBuffer;
    int iRepr, iNode, iPrevRepr, iPrevNode, iLit, nItems, iPos;
    assert( p->pReprs && p->pNexts );
    // count the number of entries to be written
    nItems = 0;
    for ( iRepr = 1; iRepr < Gia_ManObjNum(p); iRepr++ )
    {
        nItems += Gia_ObjIsConst( p, iRepr );
        if ( !Gia_ObjIsHead(p, iRepr) )
            continue;
        Gia_ClassForEachObj( p, iRepr, iNode )
            nItems++;
    }
    pBuffer = ABC_ALLOC( unsigned char, sizeof(int) * (nItems + 10) );
    // write constant class
    iPos = Gia_AigerWriteUnsignedBuffer( pBuffer, 4, Abc_Var2Lit(0, 1) );
    iPrevNode = 0;
    for ( iNode = 1; iNode < Gia_ManObjNum(p); iNode++ )
        if ( Gia_ObjIsConst(p, iNode) )
        {
            iLit = Abc_Var2Lit( iNode - iPrevNode, Gia_ObjProved(p, iNode) );
            iPrevNode = iNode;
            iPos = Gia_AigerWriteUnsignedBuffer( pBuffer, iPos, Abc_Var2Lit(iLit, 0) );
        }
    // write non-constant classes
    iPrevRepr = 0;
    Gia_ManForEachClass( p, iRepr )
    {
        iPos = Gia_AigerWriteUnsignedBuffer( pBuffer, iPos, Abc_Var2Lit(iRepr - iPrevRepr, 1) );
        iPrevRepr = iPrevNode = iRepr;
        Gia_ClassForEachObj1( p, iRepr, iNode )
        {
            iLit = Abc_Var2Lit( iNode - iPrevNode, Gia_ObjProved(p, iNode) );
            iPrevNode = iNode;
            iPos = Gia_AigerWriteUnsignedBuffer( pBuffer, iPos, Abc_Var2Lit(iLit, 0) );
        }
    }
    Gia_AigerWriteInt( pBuffer, iPos );
    *pEquivSize = iPos;
    return pBuffer;
}